

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O2

void file_get_savefile(char *filename,size_t max,char *base,char *ext)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = Rand_simple(1000000);
  strnfmt(filename,max,"%s%lu.%s",base,(ulong)uVar2,ext);
  uVar3 = 0;
  while( true ) {
    _Var1 = file_exists(filename);
    if ((!_Var1) || (99 < uVar3)) break;
    uVar3 = uVar3 + 1;
    uVar2 = Rand_simple(1000000);
    strnfmt(filename,max,"%s%lu%u.%s",base,(ulong)uVar2,(ulong)uVar3,ext);
  }
  return;
}

Assistant:

void file_get_savefile(char *filename, size_t max, const char *base,
	const char *ext)
{
	int count = 0;

	count = 0;

#ifdef DJGPP
	/* DOS needs a shorter file name */
	strnfmt(filename, max, "%s/temp.%s", dirname(base), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s/temp%u.%s", dirname(base), count,
			ext);
#else
	strnfmt(filename, max, "%s%lu.%s",
		base, (unsigned long)Rand_simple(1000000), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s%lu%u.%s",
			base, (unsigned long)Rand_simple(1000000), count, ext);
#endif /* ! DJGPP */
	return;
}